

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.h
# Opt level: O2

int libyuv::TestCpuFlag(int test_flag)

{
  uint uVar1;
  
  uVar1 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar1 = InitCpuFlags();
  }
  return uVar1 & test_flag;
}

Assistant:

static __inline int TestCpuFlag(int test_flag) {
  LIBYUV_API extern int cpu_info_;
#ifdef __ATOMIC_RELAXED
  int cpu_info = __atomic_load_n(&cpu_info_, __ATOMIC_RELAXED);
#else
  int cpu_info = cpu_info_;
#endif
  return (!cpu_info ? InitCpuFlags() : cpu_info) & test_flag;
}